

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

sqlite3_int64 integerValue(char *zArg)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  byte *zRight;
  long lVar6;
  long lVar7;
  
  cVar2 = *zArg;
  zRight = (byte *)(zArg + ((cVar2 - 0x2bU & 0xfd) == 0));
  if ((*zRight == 0x30) && (zRight[1] == 0x78)) {
    zRight = zRight + 2;
    lVar7 = 0;
    while( true ) {
      bVar3 = *zRight;
      iVar4 = (int)(char)bVar3;
      if ((byte)(bVar3 - 0x30) < 10) {
        uVar5 = iVar4 - 0x30;
      }
      else if ((byte)(bVar3 + 0x9f) < 6) {
        uVar5 = iVar4 - 0x57;
      }
      else {
        uVar5 = iVar4 - 0x37;
        if (5 < (byte)(bVar3 + 0xbf)) {
          uVar5 = 0xffffffff;
        }
      }
      if ((int)uVar5 < 0) break;
      lVar7 = lVar7 * 0x10 + (ulong)uVar5;
      zRight = zRight + 1;
    }
  }
  else {
    lVar7 = 0;
    bVar3 = *zRight;
    while (bVar3 - 0x30 < 10) {
      lVar7 = (long)(char)bVar3 + lVar7 * 10 + -0x30;
      pbVar1 = zRight + 1;
      zRight = zRight + 1;
      bVar3 = *pbVar1;
    }
  }
  lVar6 = 8;
  do {
    iVar4 = duckdb_shell_sqlite3_stricmp
                      (*(char **)((long)&metadata_commands[0x32].match_size + lVar6),(char *)zRight)
    ;
    if (iVar4 == 0) {
      lVar7 = lVar7 * *(int *)((long)&integerValue::aMult[0].zSuffix + lVar6);
      break;
    }
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x98);
  lVar6 = -lVar7;
  if (cVar2 != '-') {
    lVar6 = lVar7;
  }
  return lVar6;
}

Assistant:

static sqlite3_int64 integerValue(const char *zArg) {
	sqlite3_int64 v = 0;
	static const struct {
		const char *zSuffix;
		int iMult;
	} aMult[] = {
	    {"KiB", 1024}, {"MiB", 1024 * 1024}, {"GiB", 1024 * 1024 * 1024},
	    {"KB", 1000},  {"MB", 1000000},      {"GB", 1000000000},
	    {"K", 1000},   {"M", 1000000},       {"G", 1000000000},
	};
	int i;
	int isNeg = 0;
	if (zArg[0] == '-') {
		isNeg = 1;
		zArg++;
	} else if (zArg[0] == '+') {
		zArg++;
	}
	if (zArg[0] == '0' && zArg[1] == 'x') {
		int x;
		zArg += 2;
		while ((x = hexDigitValue(zArg[0])) >= 0) {
			v = (v << 4) + x;
			zArg++;
		}
	} else {
		while (IsDigit(zArg[0])) {
			v = v * 10 + zArg[0] - '0';
			zArg++;
		}
	}
	for (i = 0; i < ArraySize(aMult); i++) {
		if (sqlite3_stricmp(aMult[i].zSuffix, zArg) == 0) {
			v *= aMult[i].iMult;
			break;
		}
	}
	return isNeg ? -v : v;
}